

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

void agent_free_identities(LIBSSH2_AGENT *agent)

{
  agent_publickey *paVar1;
  agent_publickey *next;
  agent_publickey *node;
  LIBSSH2_AGENT *agent_local;
  
  next = (agent_publickey *)_libssh2_list_first(&agent->head);
  while (next != (agent_publickey *)0x0) {
    paVar1 = (agent_publickey *)_libssh2_list_next(&next->node);
    (*agent->session->free)((next->external).blob,&agent->session->abstract);
    (*agent->session->free)((next->external).comment,&agent->session->abstract);
    (*agent->session->free)(next,&agent->session->abstract);
    next = paVar1;
  }
  _libssh2_list_init(&agent->head);
  return;
}

Assistant:

static void
agent_free_identities(LIBSSH2_AGENT *agent)
{
    struct agent_publickey *node;
    struct agent_publickey *next;

    for(node = _libssh2_list_first(&agent->head); node; node = next) {
        next = _libssh2_list_next(&node->node);
        LIBSSH2_FREE(agent->session, node->external.blob);
        LIBSSH2_FREE(agent->session, node->external.comment);
        LIBSSH2_FREE(agent->session, node);
    }
    _libssh2_list_init(&agent->head);
}